

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::RegisterWeakReferenceDictionary
          (ScriptContext *this,IWeakReferenceDictionary *weakReferenceDictionary)

{
  IWeakReferenceDictionary *local_10;
  IWeakReferenceDictionary *weakReferenceDictionary_local;
  
  local_10 = weakReferenceDictionary;
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&this->weakReferenceDictionaryList,&this->generalAllocator,&local_10);
  return;
}

Assistant:

void ScriptContext::RegisterWeakReferenceDictionary(JsUtil::IWeakReferenceDictionary* weakReferenceDictionary)
    {
        this->weakReferenceDictionaryList.Prepend(this->GeneralAllocator(), weakReferenceDictionary);
    }